

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct32_stage9_avx2(__m256i *bf1,__m256i *out,int do_cols,int bd,int out_shift,__m256i *clamp_lo
                       ,__m256i *clamp_hi)

{
  undefined1 auVar1 [16];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i in1_11;
  __m256i in1_12;
  __m256i in1_13;
  __m256i in1_14;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i in0_07;
  __m256i in0_08;
  __m256i in0_09;
  __m256i in0_10;
  __m256i in0_11;
  __m256i in0_12;
  __m256i in0_13;
  __m256i in0_14;
  int in_ECX;
  uint uVar2;
  int in_EDX;
  __m256i *in_RSI;
  __m256i *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  int in_stack_fffffffffffffea4;
  __m256i *in_stack_fffffffffffffea8;
  undefined1 local_144;
  __m256i *in_stack_fffffffffffffed8;
  __m256i *in_stack_fffffffffffffee0;
  __m256i *in_stack_fffffffffffffee8;
  __m256i *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff00 [12];
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 uVar3;
  int size;
  undefined4 in_stack_ffffffffffffff18;
  
  uVar3 = (undefined4)in_R9;
  size = (int)((ulong)in_R9 >> 0x20);
  in0[0]._4_4_ = in_R8D;
  in0[0]._0_4_ = in_stack_ffffffffffffff18;
  in0[1]._0_4_ = in_ECX;
  in0[1]._4_4_ = in_EDX;
  in0[2] = (longlong)in_RSI;
  in0[3] = (longlong)in_RDI;
  in1._8_12_ = in_stack_ffffffffffffff00;
  in1[0] = in_stack_fffffffffffffef8;
  in1[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1[3]._0_4_ = uVar3;
  in1[3]._4_4_ = size;
  addsub_avx2(in0,in1,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
              in_stack_fffffffffffffed8);
  in0_00[0]._4_4_ = in_R8D;
  in0_00[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_00[1]._0_4_ = in_ECX;
  in0_00[1]._4_4_ = in_EDX;
  in0_00[2] = (longlong)in_RSI;
  in0_00[3] = (longlong)in_RDI;
  in1_00._8_12_ = in_stack_ffffffffffffff00;
  in1_00[0] = in_stack_fffffffffffffef8;
  in1_00[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_00[3]._0_4_ = uVar3;
  in1_00[3]._4_4_ = size;
  addsub_avx2(in0_00,in1_00,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_01[0]._4_4_ = in_R8D;
  in0_01[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_01[1]._0_4_ = in_ECX;
  in0_01[1]._4_4_ = in_EDX;
  in0_01[2] = (longlong)in_RSI;
  in0_01[3] = (longlong)in_RDI;
  in1_01._8_12_ = in_stack_ffffffffffffff00;
  in1_01[0] = in_stack_fffffffffffffef8;
  in1_01[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_01[3]._0_4_ = uVar3;
  in1_01[3]._4_4_ = size;
  addsub_avx2(in0_01,in1_01,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_02[0]._4_4_ = in_R8D;
  in0_02[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_02[1]._0_4_ = in_ECX;
  in0_02[1]._4_4_ = in_EDX;
  in0_02[2] = (longlong)in_RSI;
  in0_02[3] = (longlong)in_RDI;
  in1_02._8_12_ = in_stack_ffffffffffffff00;
  in1_02[0] = in_stack_fffffffffffffef8;
  in1_02[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_02[3]._0_4_ = uVar3;
  in1_02[3]._4_4_ = size;
  addsub_avx2(in0_02,in1_02,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_03[0]._4_4_ = in_R8D;
  in0_03[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_03[1]._0_4_ = in_ECX;
  in0_03[1]._4_4_ = in_EDX;
  in0_03[2] = (longlong)in_RSI;
  in0_03[3] = (longlong)in_RDI;
  in1_03._8_12_ = in_stack_ffffffffffffff00;
  in1_03[0] = in_stack_fffffffffffffef8;
  in1_03[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_03[3]._0_4_ = uVar3;
  in1_03[3]._4_4_ = size;
  addsub_avx2(in0_03,in1_03,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_04[0]._4_4_ = in_R8D;
  in0_04[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_04[1]._0_4_ = in_ECX;
  in0_04[1]._4_4_ = in_EDX;
  in0_04[2] = (longlong)in_RSI;
  in0_04[3] = (longlong)in_RDI;
  in1_04._8_12_ = in_stack_ffffffffffffff00;
  in1_04[0] = in_stack_fffffffffffffef8;
  in1_04[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_04[3]._0_4_ = uVar3;
  in1_04[3]._4_4_ = size;
  addsub_avx2(in0_04,in1_04,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_05[0]._4_4_ = in_R8D;
  in0_05[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_05[1]._0_4_ = in_ECX;
  in0_05[1]._4_4_ = in_EDX;
  in0_05[2] = (longlong)in_RSI;
  in0_05[3] = (longlong)in_RDI;
  in1_05._8_12_ = in_stack_ffffffffffffff00;
  in1_05[0] = in_stack_fffffffffffffef8;
  in1_05[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_05[3]._0_4_ = uVar3;
  in1_05[3]._4_4_ = size;
  addsub_avx2(in0_05,in1_05,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_06[0]._4_4_ = in_R8D;
  in0_06[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_06[1]._0_4_ = in_ECX;
  in0_06[1]._4_4_ = in_EDX;
  in0_06[2] = (longlong)in_RSI;
  in0_06[3] = (longlong)in_RDI;
  in1_06._8_12_ = in_stack_ffffffffffffff00;
  in1_06[0] = in_stack_fffffffffffffef8;
  in1_06[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_06[3]._0_4_ = uVar3;
  in1_06[3]._4_4_ = size;
  addsub_avx2(in0_06,in1_06,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_07[0]._4_4_ = in_R8D;
  in0_07[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_07[1]._0_4_ = in_ECX;
  in0_07[1]._4_4_ = in_EDX;
  in0_07[2] = (longlong)in_RSI;
  in0_07[3] = (longlong)in_RDI;
  in1_07._8_12_ = in_stack_ffffffffffffff00;
  in1_07[0] = in_stack_fffffffffffffef8;
  in1_07[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_07[3]._0_4_ = uVar3;
  in1_07[3]._4_4_ = size;
  addsub_avx2(in0_07,in1_07,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_08[0]._4_4_ = in_R8D;
  in0_08[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_08[1]._0_4_ = in_ECX;
  in0_08[1]._4_4_ = in_EDX;
  in0_08[2] = (longlong)in_RSI;
  in0_08[3] = (longlong)in_RDI;
  in1_08._8_12_ = in_stack_ffffffffffffff00;
  in1_08[0] = in_stack_fffffffffffffef8;
  in1_08[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_08[3]._0_4_ = uVar3;
  in1_08[3]._4_4_ = size;
  addsub_avx2(in0_08,in1_08,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_09[0]._4_4_ = in_R8D;
  in0_09[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_09[1]._0_4_ = in_ECX;
  in0_09[1]._4_4_ = in_EDX;
  in0_09[2] = (longlong)in_RSI;
  in0_09[3] = (longlong)in_RDI;
  in1_09._8_12_ = in_stack_ffffffffffffff00;
  in1_09[0] = in_stack_fffffffffffffef8;
  in1_09[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_09[3]._0_4_ = uVar3;
  in1_09[3]._4_4_ = size;
  addsub_avx2(in0_09,in1_09,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_10[0]._4_4_ = in_R8D;
  in0_10[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_10[1]._0_4_ = in_ECX;
  in0_10[1]._4_4_ = in_EDX;
  in0_10[2] = (longlong)in_RSI;
  in0_10[3] = (longlong)in_RDI;
  in1_10._8_12_ = in_stack_ffffffffffffff00;
  in1_10[0] = in_stack_fffffffffffffef8;
  in1_10[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_10[3]._0_4_ = uVar3;
  in1_10[3]._4_4_ = size;
  addsub_avx2(in0_10,in1_10,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_11[0]._4_4_ = in_R8D;
  in0_11[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_11[1]._0_4_ = in_ECX;
  in0_11[1]._4_4_ = in_EDX;
  in0_11[2] = (longlong)in_RSI;
  in0_11[3] = (longlong)in_RDI;
  in1_11._8_12_ = in_stack_ffffffffffffff00;
  in1_11[0] = in_stack_fffffffffffffef8;
  in1_11[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_11[3]._0_4_ = uVar3;
  in1_11[3]._4_4_ = size;
  addsub_avx2(in0_11,in1_11,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_12[0]._4_4_ = in_R8D;
  in0_12[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_12[1]._0_4_ = in_ECX;
  in0_12[1]._4_4_ = in_EDX;
  in0_12[2] = (longlong)in_RSI;
  in0_12[3] = (longlong)in_RDI;
  in1_12._8_12_ = in_stack_ffffffffffffff00;
  in1_12[0] = in_stack_fffffffffffffef8;
  in1_12[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_12[3]._0_4_ = uVar3;
  in1_12[3]._4_4_ = size;
  addsub_avx2(in0_12,in1_12,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_13[0]._4_4_ = in_R8D;
  in0_13[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_13[1]._0_4_ = in_ECX;
  in0_13[1]._4_4_ = in_EDX;
  in0_13[2] = (longlong)in_RSI;
  in0_13[3] = (longlong)in_RDI;
  in1_13._8_12_ = in_stack_ffffffffffffff00;
  in1_13[0] = in_stack_fffffffffffffef8;
  in1_13[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_13[3]._0_4_ = uVar3;
  in1_13[3]._4_4_ = size;
  addsub_avx2(in0_13,in1_13,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in0_14[0]._4_4_ = in_R8D;
  in0_14[0]._0_4_ = in_stack_ffffffffffffff18;
  in0_14[1]._0_4_ = in_ECX;
  in0_14[1]._4_4_ = in_EDX;
  in0_14[2] = (longlong)in_RSI;
  in0_14[3] = (longlong)in_RDI;
  in1_14._8_12_ = in_stack_ffffffffffffff00;
  in1_14[0] = in_stack_fffffffffffffef8;
  in1_14[2]._4_4_ = in_stack_ffffffffffffff0c;
  in1_14[3]._0_4_ = uVar3;
  in1_14[3]._4_4_ = size;
  addsub_avx2(in0_14,in1_14,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (in_EDX == 0) {
    if (in_ECX + 6 < 0x10) {
      local_144 = '\x10';
    }
    else {
      local_144 = (char)in_ECX + '\x06';
    }
    uVar2 = -(1 << (local_144 - 1U & 0x1f));
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    uVar2 = (1 << (local_144 - 1U & 0x1f)) - 1;
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    round_shift_8x8_avx2(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    round_shift_8x8_avx2(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    highbd_clamp_epi32_avx2
              (in_RDI,in_RSI,(__m256i *)CONCAT44(in_EDX,in_ECX),
               (__m256i *)CONCAT44(in_R8D,in_stack_ffffffffffffff18),size);
  }
  return;
}

Assistant:

static inline void idct32_stage9_avx2(__m256i *output, __m256i *x) {
  btf_16_adds_subs_out_avx2(&output[0], &output[31], x[0], x[31]);
  btf_16_adds_subs_out_avx2(&output[1], &output[30], x[1], x[30]);
  btf_16_adds_subs_out_avx2(&output[2], &output[29], x[2], x[29]);
  btf_16_adds_subs_out_avx2(&output[3], &output[28], x[3], x[28]);
  btf_16_adds_subs_out_avx2(&output[4], &output[27], x[4], x[27]);
  btf_16_adds_subs_out_avx2(&output[5], &output[26], x[5], x[26]);
  btf_16_adds_subs_out_avx2(&output[6], &output[25], x[6], x[25]);
  btf_16_adds_subs_out_avx2(&output[7], &output[24], x[7], x[24]);
  btf_16_adds_subs_out_avx2(&output[8], &output[23], x[8], x[23]);
  btf_16_adds_subs_out_avx2(&output[9], &output[22], x[9], x[22]);
  btf_16_adds_subs_out_avx2(&output[10], &output[21], x[10], x[21]);
  btf_16_adds_subs_out_avx2(&output[11], &output[20], x[11], x[20]);
  btf_16_adds_subs_out_avx2(&output[12], &output[19], x[12], x[19]);
  btf_16_adds_subs_out_avx2(&output[13], &output[18], x[13], x[18]);
  btf_16_adds_subs_out_avx2(&output[14], &output[17], x[14], x[17]);
  btf_16_adds_subs_out_avx2(&output[15], &output[16], x[15], x[16]);
}